

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetectionResultColumn.cpp
# Opt level: O3

void __thiscall
ZXing::Pdf417::DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers
          (DetectionResultColumn *this,BarcodeMetadata *barcodeMetadata)

{
  RowIndicator RVar1;
  int iVar2;
  pointer pNVar3;
  pointer pNVar4;
  int iVar5;
  Nullable<ZXing::ResultPoint> *pNVar6;
  Nullable<ZXing::ResultPoint> *pNVar7;
  uint uVar8;
  Nullable<ZXing::Pdf417::Codeword> *codeword;
  pointer pNVar9;
  bool *pbVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  char cVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  Codeword codeword_1;
  int local_60;
  uint local_5c;
  Codeword local_44;
  
  RVar1 = this->_rowIndicator;
  if (RVar1 != None) {
    pNVar4 = (this->_codewords).
             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pNVar3 = (this->_codewords).
             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pNVar9 = pNVar3; pNVar9 != pNVar4; pNVar9 = pNVar9 + 1) {
      if (*(char *)&(((_Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                       *)&pNVar9->m_hasValue)->_M_impl).super__Vector_impl_data._M_start == '\x01')
      {
        (pNVar9->m_value)._rowNumber =
             (pNVar9->m_value)._bucket / 3 + ((pNVar9->m_value)._value / 0x1e) * 3;
      }
    }
    RemoveIncorrectCodewords
              ((Pdf417 *)(ulong)(RVar1 == Left),SUB81(pNVar3,0),
               (vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                *)pNVar4,barcodeMetadata);
    pNVar6 = &(this->_boundingBox)._topLeft;
    pNVar7 = &(this->_boundingBox)._bottomLeft;
    if (this->_rowIndicator != Left) {
      pNVar7 = &(this->_boundingBox)._bottomRight;
      pNVar6 = &(this->_boundingBox)._topRight;
    }
    iVar17 = (int)(pNVar6->m_value).super_PointF.y;
    iVar18 = (int)(pNVar7->m_value).super_PointF.y;
    if (iVar17 < iVar18) {
      iVar2 = (this->_boundingBox)._minY;
      lVar16 = (long)(iVar17 - iVar2);
      lVar13 = lVar16 * 0x18 + -0x18;
      local_60 = 0;
      iVar17 = -1;
      local_5c = 1;
      iVar5 = 1;
      do {
        pNVar3 = (this->_codewords).
                 super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pNVar3[lVar16].m_hasValue == true) {
          Nullable::operator_cast_to_Codeword(&local_44,(Nullable *)(pNVar3 + lVar16));
          if (iVar17 == -1) {
            iVar17 = barcodeMetadata->_rowCountLowerPart + barcodeMetadata->_rowCountUpperPart;
            if (local_44._rowNumber ==
                barcodeMetadata->_rowCountUpperPart + barcodeMetadata->_rowCountLowerPart + -1) {
              local_5c = 0xffffffff;
            }
            else {
              iVar17 = -1;
            }
          }
          uVar8 = local_44._rowNumber - iVar17;
          if (uVar8 == 0) {
            local_60 = local_60 + 1;
            iVar17 = local_44._rowNumber;
          }
          else if (uVar8 == local_5c) {
            iVar11 = local_60;
            if (local_60 < iVar5) {
              iVar11 = iVar5;
            }
LAB_001722a1:
            local_60 = 1;
            iVar17 = local_44._rowNumber;
            iVar5 = iVar11;
          }
          else {
            if (((-1 < (int)uVar8) && ((long)(ulong)uVar8 <= lVar16)) &&
               (local_44._rowNumber <
                barcodeMetadata->_rowCountLowerPart + barcodeMetadata->_rowCountUpperPart)) {
              iVar11 = iVar5 + -2;
              if (iVar5 < 3) {
                iVar11 = 1;
              }
              lVar12 = (long)(int)(uVar8 * iVar11);
              cVar14 = lVar16 <= lVar12;
              if ((lVar12 < lVar16) && (0 < (int)(uVar8 * iVar11))) {
                pbVar10 = &((this->_codewords).
                            super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_hasValue + lVar13;
                lVar15 = 1;
                do {
                  cVar14 = *pbVar10;
                  if (lVar12 <= lVar15) break;
                  lVar15 = lVar15 + 1;
                  pbVar10 = pbVar10 + -0x18;
                } while ((bool)cVar14 == false);
              }
              iVar11 = iVar5;
              if (cVar14 == '\0') goto LAB_001722a1;
            }
            pNVar3 = (this->_codewords).
                     super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pNVar3[lVar16].m_hasValue = false;
            pNVar4 = pNVar3 + lVar16;
            (pNVar4->m_value)._startX = 0;
            (pNVar4->m_value)._endX = 0;
            (pNVar4->m_value)._bucket = 0;
            (pNVar4->m_value)._value = 0;
            pNVar3[lVar16].m_value._rowNumber = -1;
          }
        }
        lVar16 = lVar16 + 1;
        lVar13 = lVar13 + 0x18;
      } while (lVar16 < iVar18 - iVar2);
    }
  }
  return;
}

Assistant:

void
DetectionResultColumn::adjustCompleteIndicatorColumnRowNumbers(const BarcodeMetadata& barcodeMetadata)
{
	if (!isRowIndicator()) {
		return;
	}

	auto& codewords = allCodewords();
	setRowNumbers();
	RemoveIncorrectCodewords(isLeftRowIndicator(), codewords, barcodeMetadata);
	const auto& bb = boundingBox();
	auto top = isLeftRowIndicator() ? bb.topLeft() : bb.topRight();
	auto bottom = isLeftRowIndicator() ? bb.bottomLeft() : bb.bottomRight();
	int firstRow = imageRowToCodewordIndex((int)top.value().y());
	int lastRow = imageRowToCodewordIndex((int)bottom.value().y());
	// We need to be careful using the average row height. Barcode could be skewed so that we have smaller and
	// taller rows
	//float averageRowHeight = (lastRow - firstRow) / (float)barcodeMetadata.rowCount();
	int barcodeRow = -1;
	int maxRowHeight = 1;
	int currentRowHeight = 0;
	int increment = 1;
	for (int codewordsRow = firstRow; codewordsRow < lastRow; codewordsRow++) {
		if (codewords[codewordsRow] == nullptr) {
			continue;
		}
		Codeword codeword = codewords[codewordsRow];
		if (barcodeRow == -1 && codeword.rowNumber() == barcodeMetadata.rowCount() - 1) {
			increment = -1;
			barcodeRow = barcodeMetadata.rowCount();
		}
		//      float expectedRowNumber = (codewordsRow - firstRow) / averageRowHeight;
		//      if (Math.abs(codeword.getRowNumber() - expectedRowNumber) > 2) {
		//        SimpleLog.log(LEVEL.WARNING,
		//            "Removing codeword, rowNumberSkew too high, codeword[" + codewordsRow + "]: Expected Row: " +
		//                expectedRowNumber + ", RealRow: " + codeword.getRowNumber() + ", value: " + codeword.getValue());
		//        codewords[codewordsRow] = null;
		//      }

		int rowDifference = codeword.rowNumber() - barcodeRow;

		if (rowDifference == 0) {
			currentRowHeight++;
		}
		else if (rowDifference == increment) {
			maxRowHeight = std::max(maxRowHeight, currentRowHeight);
			currentRowHeight = 1;
			barcodeRow = codeword.rowNumber();
		}
		else if (rowDifference < 0 ||
			codeword.rowNumber() >= barcodeMetadata.rowCount() ||
			rowDifference > codewordsRow) {
			codewords[codewordsRow] = nullptr;
		}
		else {
			int checkedRows;
			if (maxRowHeight > 2) {
				checkedRows = (maxRowHeight - 2) * rowDifference;
			}
			else {
				checkedRows = rowDifference;
			}
			bool closePreviousCodewordFound = checkedRows >= codewordsRow;
			for (int i = 1; i <= checkedRows && !closePreviousCodewordFound; i++) {
				// there must be (height * rowDifference) number of codewords missing. For now we assume height = 1.
				// This should hopefully get rid of most problems already.
				closePreviousCodewordFound = codewords[codewordsRow - i] != nullptr;
			}
			if (closePreviousCodewordFound) {
				codewords[codewordsRow] = nullptr;
			}
			else {
				barcodeRow = codeword.rowNumber();
				currentRowHeight = 1;
			}
		}
	}
	//return static_cast<int>(averageRowHeight + 0.5);
}